

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alias.c
# Opt level: O0

void substitute_alias(DESCRIPTOR_DATA *d,char *argument)

{
  bool bVar1;
  int iVar2;
  char *txt;
  size_t sVar3;
  undefined8 in_RSI;
  long in_RDI;
  int alias;
  char *point;
  char name [4608];
  char buf [4608];
  CHAR_DATA *ch;
  char *in_stack_00004930;
  CHAR_DATA *in_stack_00004938;
  CHAR_DATA *in_stack_ffffffffffffdbc8;
  char *argument_00;
  undefined4 in_stack_ffffffffffffdbd8;
  int iVar4;
  char local_2418 [8];
  char *in_stack_ffffffffffffdbf0;
  char *in_stack_ffffffffffffdbf8;
  char local_1218 [4607];
  undefined1 local_19;
  char *local_18;
  undefined8 local_10;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    argument_00 = *(char **)(in_RDI + 0x10);
  }
  else {
    argument_00 = *(char **)(in_RDI + 0x18);
  }
  local_18 = argument_00;
  local_10 = in_RSI;
  bVar1 = is_npc(in_stack_ffffffffffffdbc8);
  if ((((bVar1) || (*(long *)(*(long *)(local_18 + 0xc0) + 0xa60) == 0)) ||
      (bVar1 = str_prefix(in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0), !bVar1)) ||
     ((bVar1 = str_prefix(in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0), !bVar1 ||
      (bVar1 = str_prefix(in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0), !bVar1)))) {
    interpret(in_stack_00004938,in_stack_00004930);
    return;
  }
  sprintf(local_1218,"%s",local_10);
  iVar4 = 0;
  do {
    if ((9 < iVar4) || (*(long *)(*(long *)(local_18 + 0xc0) + 0xa60 + (long)iVar4 * 8) == 0))
    goto LAB_005a3401;
    bVar1 = str_prefix(in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    if (!bVar1) {
      txt = one_argument(argument_00,(char *)in_stack_ffffffffffffdbc8);
      iVar2 = strcmp(*(char **)(*(long *)(local_18 + 0xc0) + 0xa60 + (long)iVar4 * 8),local_2418);
      if (iVar2 == 0) {
        local_1218[0] = '\0';
        strcat(local_1218,*(char **)(*(long *)(local_18 + 0xc0) + 0xab0 + (long)iVar4 * 8));
        strcat(local_1218," ");
        strcat(local_1218,txt);
LAB_005a3401:
        interpret(in_stack_00004938,in_stack_00004930);
        return;
      }
      sVar3 = strlen(local_1218);
      if (0x1200 < sVar3) {
        send_to_char(txt,(CHAR_DATA *)CONCAT44(iVar4,in_stack_ffffffffffffdbd8));
        local_19 = 0;
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void substitute_alias(DESCRIPTOR_DATA *d, char *argument)
{
	CHAR_DATA *ch;
	char buf[MAX_STRING_LENGTH], name[MAX_INPUT_LENGTH];
	char *point;
	int alias;

	ch = d->original ? d->original : d->character;

	if (is_npc(ch)
		|| ch->pcdata->alias[0] == nullptr
		|| !str_prefix("alias", argument)
		|| !str_prefix("una", argument)
		|| !str_prefix("prefix", argument))
	{
		interpret(d->character, argument);
		return;
	}

	sprintf(buf, "%s", argument);

	for (alias = 0; alias < MAX_ALIAS; alias++) /* go through the aliases */
	{
		if (ch->pcdata->alias[alias] == nullptr)
			break;

		if (!str_prefix(ch->pcdata->alias[alias], argument))
		{
			point = one_argument(argument, name);

			if (!strcmp(ch->pcdata->alias[alias], name))
			{
				buf[0] = '\0';

				strcat(buf, ch->pcdata->alias_sub[alias]);
				strcat(buf, " ");
				strcat(buf, point);
				break;
			}

			if (strlen(buf) > MAX_INPUT_LENGTH)
			{
				send_to_char("Alias substitution too long. Truncated.\r\n", ch);
				buf[MAX_INPUT_LENGTH - 1] = '\0';
			}
		}
	}

	interpret(d->character, buf);
}